

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O0

int nghttp3_qpack_stream_add_ref(nghttp3_qpack_stream *stream,nghttp3_qpack_header_block_ref *ref)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 in_RSI;
  long in_RDI;
  int rv;
  nghttp3_qpack_header_block_ref **dest;
  nghttp3_pq_entry *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  iVar1 = nghttp3_ringbuf_full((nghttp3_ringbuf *)(in_RDI + 8));
  if (iVar1 != 0) {
    in_stack_ffffffffffffffd0 = (nghttp3_pq_entry *)(in_RDI + 8);
    nghttp3_max_size(4,*(long *)(in_RDI + 0x30) << 1);
    iVar1 = nghttp3_ringbuf_reserve
                      ((nghttp3_ringbuf *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (size_t)in_stack_ffffffffffffffd0);
    if (iVar1 != 0) {
      return iVar1;
    }
    in_stack_ffffffffffffffdc = 0;
  }
  local_4 = nghttp3_pq_push((nghttp3_pq *)
                            CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                            in_stack_ffffffffffffffd0);
  if (local_4 == 0) {
    puVar2 = (undefined8 *)nghttp3_ringbuf_push_back((nghttp3_ringbuf *)(in_RDI + 8));
    *puVar2 = in_RSI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nghttp3_qpack_stream_add_ref(nghttp3_qpack_stream *stream,
                                 nghttp3_qpack_header_block_ref *ref) {
  nghttp3_qpack_header_block_ref **dest;
  int rv;

  if (nghttp3_ringbuf_full(&stream->refs)) {
    rv = nghttp3_ringbuf_reserve(
      &stream->refs,
      nghttp3_max_size(4, nghttp3_ringbuf_len(&stream->refs) * 2));
    if (rv != 0) {
      return rv;
    }
  }

  rv = nghttp3_pq_push(&stream->max_cnts, &ref->max_cnts_pe);
  if (rv != 0) {
    return rv;
  }

  dest = nghttp3_ringbuf_push_back(&stream->refs);
  *dest = ref;

  return 0;
}